

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O0

cpu_times * __thiscall lf::base::Timer::Elapsed(cpu_times *__return_storage_ptr__,Timer *this)

{
  bool bVar1;
  Timer *this_local;
  
  bVar1 = IsStopped(this);
  if (bVar1) {
    (__return_storage_ptr__->wall).__r = (this->times_).wall.__r;
    (__return_storage_ptr__->user).__r = (this->times_).user.__r;
    (__return_storage_ptr__->system).__r = (this->times_).system.__r;
  }
  else {
    anon_unknown.dwarf_14a442::get_cpu_times(__return_storage_ptr__);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
              (&__return_storage_ptr__->wall,(duration<long,_std::ratio<1L,_1000000000L>_> *)this);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
              (&__return_storage_ptr__->user,&(this->times_).user);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
              (&__return_storage_ptr__->system,&(this->times_).system);
  }
  return __return_storage_ptr__;
}

Assistant:

Timer::cpu_times Timer::Elapsed() const noexcept {
  if (IsStopped()) {
    return times_;
  }

  cpu_times current;  // NOLINT
  get_cpu_times(&current);
  current.wall -= times_.wall;
  current.user -= times_.user;
  current.system -= times_.system;

  return current;
}